

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

void __thiscall Js::SourceTextModuleRecord::NotifyParentsAsNeeded(SourceTextModuleRecord *this)

{
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  int i;
  long lVar2;
  
  if (this->notifying == false) {
    this->notifying = true;
    pLVar1 = (this->parentModuleList).ptr;
    if (pLVar1 != (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      for (lVar2 = 0;
          lVar2 < (pLVar1->
                  super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                  ).count; lVar2 = lVar2 + 1) {
        OnChildModuleReady((pLVar1->
                           super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                           ).buffer.ptr[lVar2].ptr,this,(this->errorObject).ptr);
      }
    }
    this->notifying = false;
    this->parentsNotified = true;
  }
  return;
}

Assistant:

void SourceTextModuleRecord::NotifyParentsAsNeeded()
    {
        if (notifying)
        {
            return;
        }
        notifying = true;
        // Notify the parent modules that this child module is either in fault state or finished.
        if (this->parentModuleList != nullptr)
        {
            parentModuleList->Map([=](uint i, SourceTextModuleRecord* parentModule)
            {
                parentModule->OnChildModuleReady(this, this->errorObject);
            });
        }
        notifying = false;
        SetParentsNotified();
    }